

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void resetAccumulator(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  ExprList *pEVar1;
  Expr *pEVar2;
  int iVar3;
  int iVar4;
  KeyInfo *pKVar5;
  u8 *puVar6;
  uint nExtra;
  
  iVar3 = pAggInfo->nColumn + pAggInfo->nFunc;
  if ((iVar3 != 0) && (pParse->nErr == 0)) {
    p = pParse->pVdbe;
    sqlite3VdbeAddOp3(p,0x4b,0,pAggInfo->iFirstReg,iVar3 + pAggInfo->iFirstReg + -1);
    puVar6 = &pAggInfo->aFunc->bUseSubtype;
    for (iVar3 = 0; iVar3 < pAggInfo->nFunc; iVar3 = iVar3 + 1) {
      if (-1 < *(int *)(puVar6 + -0xe)) {
        pEVar1 = (((AggInfo_func *)(puVar6 + -0x1e))->pFExpr->x).pList;
        if ((pEVar1 == (ExprList *)0x0) || (pEVar1->nExpr != 1)) {
          sqlite3ErrorMsg(pParse,"DISTINCT aggregates must have exactly one argument");
          *(int *)(puVar6 + -0xe) = -1;
        }
        else {
          pKVar5 = sqlite3KeyInfoFromExprList(pParse,pEVar1,0,0);
          iVar4 = sqlite3VdbeAddOp4(p,0x76,*(int *)(puVar6 + -0xe),0,0,(char *)pKVar5,-8);
          *(int *)(puVar6 + -10) = iVar4;
          sqlite3VdbeExplain(pParse,'\0',"USE TEMP B-TREE FOR %s(DISTINCT)");
        }
      }
      if (-1 < *(int *)(puVar6 + -6)) {
        pEVar2 = ((AggInfo_func *)(puVar6 + -0x1e))->pFExpr;
        nExtra = (uint)(puVar6[-1] == '\0');
        if (puVar6[-2] != '\0') {
          nExtra = (uint)(puVar6[-1] == '\0') + ((pEVar2->x).pList)->nExpr;
        }
        if (*puVar6 != '\0') {
          nExtra = nExtra + ((pEVar2->x).pList)->nExpr;
        }
        pEVar1 = (pEVar2->pLeft->x).pList;
        pKVar5 = sqlite3KeyInfoFromExprList(pParse,pEVar1,0,nExtra);
        if ((puVar6[-1] == '\0') && (pParse->nErr == 0)) {
          pKVar5->nKeyField = pKVar5->nKeyField + 1;
        }
        sqlite3VdbeAddOp4(p,0x76,*(int *)(puVar6 + -6),nExtra + pEVar1->nExpr,0,(char *)pKVar5,-8);
        sqlite3VdbeExplain(pParse,'\0',"USE TEMP B-TREE FOR %s(ORDER BY)");
      }
      puVar6 = puVar6 + 0x20;
    }
  }
  return;
}

Assistant:

static void resetAccumulator(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pFunc;
  int nReg = pAggInfo->nFunc + pAggInfo->nColumn;
  assert( pAggInfo->iFirstReg>0 );
  assert( pParse->db->pParse==pParse );
  assert( pParse->db->mallocFailed==0 || pParse->nErr!=0 );
  if( nReg==0 ) return;
  if( pParse->nErr ) return;
  sqlite3VdbeAddOp3(v, OP_Null, 0, pAggInfo->iFirstReg,
                    pAggInfo->iFirstReg+nReg-1);
  for(pFunc=pAggInfo->aFunc, i=0; i<pAggInfo->nFunc; i++, pFunc++){
    if( pFunc->iDistinct>=0 ){
      Expr *pE = pFunc->pFExpr;
      assert( ExprUseXList(pE) );
      if( pE->x.pList==0 || pE->x.pList->nExpr!=1 ){
        sqlite3ErrorMsg(pParse, "DISTINCT aggregates must have exactly one "
           "argument");
        pFunc->iDistinct = -1;
      }else{
        KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pE->x.pList,0,0);
        pFunc->iDistAddr = sqlite3VdbeAddOp4(v, OP_OpenEphemeral,
            pFunc->iDistinct, 0, 0, (char*)pKeyInfo, P4_KEYINFO);
        ExplainQueryPlan((pParse, 0, "USE TEMP B-TREE FOR %s(DISTINCT)",
                          pFunc->pFunc->zName));
      }
    }
    if( pFunc->iOBTab>=0 ){
      ExprList *pOBList;
      KeyInfo *pKeyInfo;
      int nExtra = 0;
      assert( pFunc->pFExpr->pLeft!=0 );
      assert( pFunc->pFExpr->pLeft->op==TK_ORDER );
      assert( ExprUseXList(pFunc->pFExpr->pLeft) );
      assert( pFunc->pFunc!=0 );
      pOBList = pFunc->pFExpr->pLeft->x.pList;
      if( !pFunc->bOBUnique ){
        nExtra++;  /* One extra column for the OP_Sequence */
      }
      if( pFunc->bOBPayload ){
        /* extra columns for the function arguments */
        assert( ExprUseXList(pFunc->pFExpr) );
        nExtra += pFunc->pFExpr->x.pList->nExpr;
      }
      if( pFunc->bUseSubtype ){
        nExtra += pFunc->pFExpr->x.pList->nExpr;
      }
      pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pOBList, 0, nExtra);
      if( !pFunc->bOBUnique && pParse->nErr==0 ){
        pKeyInfo->nKeyField++;
      }
      sqlite3VdbeAddOp4(v, OP_OpenEphemeral,
            pFunc->iOBTab, pOBList->nExpr+nExtra, 0,
            (char*)pKeyInfo, P4_KEYINFO);
      ExplainQueryPlan((pParse, 0, "USE TEMP B-TREE FOR %s(ORDER BY)",
                          pFunc->pFunc->zName));
    }
  }
}